

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::LocalVariableDeclarationSyntax::LocalVariableDeclarationSyntax
          (LocalVariableDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token var,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  DeclaratorSyntax *pDVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  iterator_base<slang::syntax::DeclaratorSyntax_*> local_38;
  
  uVar5 = var._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,LocalVariableDeclaration,attributes);
  (this->var).kind = (short)uVar5;
  (this->var).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->var).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->var).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->var).info = var.info;
  (this->type).ptr = type;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002db060;
  sVar1 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_38.index = 0;
  sVar1 = (this->declarators).elements._M_extent._M_extent_value;
  local_38.list = &this->declarators;
  for (; (local_38.list != &this->declarators || (local_38.index != sVar1 + 1 >> 1));
      local_38.index = local_38.index + 1) {
    pDVar4 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference(&local_38);
    (pDVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

LocalVariableDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token var, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::LocalVariableDeclaration, attributes), var(var), type(&type), declarators(declarators), semi(semi) {
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }